

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O0

void raptor_string_to_sockaddr(raptor_resolved_address *out,char *addr,int port)

{
  int iVar1;
  raptor_sockaddr_in *addr4;
  raptor_sockaddr_in6 *addr6;
  int port_local;
  char *addr_local;
  raptor_resolved_address *out_local;
  
  memset(out,0,0x84);
  iVar1 = inet_pton(10,addr,out->addr + 8);
  if (iVar1 == 1) {
    out->addr[0] = '\n';
    out->addr[1] = '\0';
    out->len = 0x1c;
  }
  else {
    iVar1 = inet_pton(2,addr,out->addr + 4);
    if (iVar1 != 1) {
      raptor::LogFormatPrint
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/socket_util.cc"
                 ,0xdb,kLogLevelError,"assertion failed: %s","0");
      abort();
    }
    out->addr[0] = '\x02';
    out->addr[1] = '\0';
    out->len = 0x10;
  }
  raptor_sockaddr_set_port(out,port);
  return;
}

Assistant:

void raptor_string_to_sockaddr(raptor_resolved_address* out, char* addr, int port) {
    memset(out, 0, sizeof(raptor_resolved_address));
    raptor_sockaddr_in6* addr6 = (raptor_sockaddr_in6*)out->addr;
    raptor_sockaddr_in* addr4 = (raptor_sockaddr_in*)out->addr;
    if (inet_pton(AF_INET6, addr, &addr6->sin6_addr) == 1) {
        addr6->sin6_family = AF_INET6;
        out->len = sizeof(raptor_sockaddr_in6);
    } else if (inet_pton(AF_INET, addr, &addr4->sin_addr) == 1) {
        addr4->sin_family = AF_INET;
        out->len = sizeof(raptor_sockaddr_in);
    } else {
        RAPTOR_ASSERT(0);
    }
    raptor_sockaddr_set_port(out, port);
}